

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::HingeLossParameter::Clear(HingeLossParameter *this)

{
  HingeLossParameter *this_local;
  
  this->norm_ = 1;
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void HingeLossParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.HingeLossParameter)
  norm_ = 1;
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}